

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlibemu_opl_inc.c
# Opt level: O2

void change_attackrate(OPL_DATA_conflict *chip,Bitu regbase,op_type_conflict *op_pt)

{
  int iVar1;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  double dVar6;
  
  if (chip->adlibreg[(ulong)regbase + 0x60] < 0x10) {
    op_pt->a0 = 0.0;
    op_pt->a1 = 1.0;
    op_pt->env_step_a = 0;
    op_pt->env_step_skip_a = 0;
    op_pt->a2 = 0.0;
    op_pt->a3 = 0.0;
  }
  else {
    bVar2 = chip->adlibreg[(ulong)regbase + 0x60] >> 4;
    dVar6 = exp2((double)(op_pt->toff >> 2) + (double)bVar2 + -1.0);
    iVar1 = op_pt->toff + (uint)bVar2 * 4;
    uVar3 = op_pt->toff & 3;
    dVar6 = dVar6 * attackconst[uVar3] * chip->recipsamp;
    op_pt->a0 = dVar6 * 0.0377;
    op_pt->a1 = dVar6 * 10.73 + 1.0;
    op_pt->a2 = dVar6 * -17.57;
    op_pt->a3 = dVar6 * 7.42;
    uVar5 = ~(-1 << (0xcU - (char)(iVar1 >> 2) & 0x1f));
    if (0xc < iVar1 >> 2) {
      uVar5 = 0;
    }
    op_pt->env_step_a = uVar5;
    uVar4 = (ulong)(4 - uVar3);
    if (0x30 < iVar1) {
      uVar4 = 0;
    }
    op_pt->env_step_skip_a = (uint)change_attackrate::step_skip_mask[uVar4];
    if (0x3b < iVar1) {
      op_pt->a0 = 2.0;
      op_pt->a1 = 0.0;
      op_pt->a2 = 0.0;
      op_pt->a3 = 0.0;
    }
  }
  return;
}

Assistant:

static void change_attackrate(OPL_DATA* chip, Bitu regbase, op_type* op_pt)
{
	Bits attackrate = chip->adlibreg[ARC_ATTR_DECR+regbase]>>4;
	if (attackrate)
	{
		static Bit8u step_skip_mask[5] = {0xff, 0xfe, 0xee, 0xba, 0xaa}; 
		Bits step_skip;
		Bits steps;
		Bits step_num;
		
		fltype f = (fltype)(pow(FL2,(fltype)attackrate+(op_pt->toff>>2)-1)*attackconst[op_pt->toff&3]*chip->recipsamp);
		// attack rate coefficients
		op_pt->a0 = (fltype)(0.0377*f);
		op_pt->a1 = (fltype)(10.73*f+1);
		op_pt->a2 = (fltype)(-17.57*f);
		op_pt->a3 = (fltype)(7.42*f);

		step_skip = attackrate*4 + op_pt->toff;
		steps = step_skip >> 2;
		op_pt->env_step_a = (1<<(steps<=12?12-steps:0))-1;

		step_num = (step_skip<=48)?(4-(step_skip&3)):0;
		op_pt->env_step_skip_a = step_skip_mask[step_num];

#if defined(OPLTYPE_IS_OPL3)
		if (step_skip>=60)
#else
		if (step_skip>=62)
#endif
		{
			op_pt->a0 = (fltype)(2.0);	// something that triggers an immediate transition to amp:=1.0
			op_pt->a1 = (fltype)(0.0);
			op_pt->a2 = (fltype)(0.0);
			op_pt->a3 = (fltype)(0.0);
		}
	}
	else
	{
		// attack disabled
		op_pt->a0 = 0.0;
		op_pt->a1 = 1.0;
		op_pt->a2 = 0.0;
		op_pt->a3 = 0.0;
		op_pt->env_step_a = 0;
		op_pt->env_step_skip_a = 0;
	}
}